

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toml.h
# Opt level: O2

Value * __thiscall toml::Value::ensureValue(Value *this,string *key)

{
  TokenType TVar1;
  Type TVar2;
  Value *pVVar3;
  istream *this_00;
  Value *local_280;
  string part;
  undefined1 local_258 [8];
  _Alloc_hider _Stack_250;
  size_type local_248;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_240;
  int64_t local_230;
  Value local_218;
  Token t;
  Lexer lexer;
  istringstream ss;
  streamsize asStack_1b0 [2];
  streamsize *local_1a0;
  streamsize *local_198;
  undefined8 local_190;
  
  TVar2 = this->type_;
  if (TVar2 == NULL_TYPE) {
    local_1a0 = asStack_1b0;
    _ss = (_func_int **)0x0;
    asStack_1b0[0] = 0;
    asStack_1b0[1] = 0;
    local_190 = 0;
    local_198 = local_1a0;
    Value((Value *)&t,(Table *)&ss);
    operator=(this,(Value *)&t);
    ~Value((Value *)&t);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>_>_>
                 *)&ss);
    TVar2 = this->type_;
  }
  if (TVar2 == TABLE_TYPE) {
    this_00 = (istream *)&ss;
    std::__cxx11::istringstream::istringstream((istringstream *)this_00,(string *)key,_S_in);
    lexer.lineNo_ = 1;
    local_280 = this;
    lexer.is_ = this_00;
    do {
      internal::Lexer::nextKeyToken(&t,&lexer);
      if (1 < t.type_ - IDENT) {
        failwith<char_const(&)[12]>((char (*) [12])"invalid key");
      }
      std::__cxx11::string::string((string *)&part,(string *)&t.str_value_);
      internal::Lexer::nextKeyToken((Token *)local_258,&lexer);
      internal::Token::operator=(&t,(Token *)local_258);
      std::__cxx11::string::~string((string *)&_Stack_250);
      TVar1 = t.type_;
      if (t.type_ == DOT) {
        pVVar3 = findChild(local_280,&part);
        if (pVVar3 == (Value *)0x0) {
          local_258 = (undefined1  [8])0x0;
          _Stack_250._M_p = (pointer)0x0;
          local_248 = 0;
          local_240._M_allocated_capacity = (size_type)&_Stack_250;
          local_230 = 0;
          local_240._8_8_ = local_240._M_allocated_capacity;
          Value(&local_218,(Table *)local_258);
          local_280 = setChild(local_280,&part,&local_218);
          ~Value(&local_218);
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>_>_>
          ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>_>_>
                       *)local_258);
        }
        else {
          local_280 = pVVar3;
          if (pVVar3->type_ != TABLE_TYPE) {
            failwith<char_const(&)[28]>((char (*) [28])"encountered non table value");
          }
        }
      }
      else {
        if (t.type_ != END_OF_FILE) {
          failwith<char_const(&)[12]>((char (*) [12])"invalid key");
        }
        this_00 = (istream *)findChild(local_280,&part);
        if (this_00 == (istream *)0x0) {
          local_258 = (undefined1  [8])((ulong)local_258 & 0xffffffff00000000);
          _Stack_250._M_p = (pointer)0x0;
          this_00 = (istream *)setChild(local_280,&part,(Value *)local_258);
          ~Value((Value *)local_258);
        }
      }
      std::__cxx11::string::~string((string *)&part);
      std::__cxx11::string::~string((string *)&t.str_value_);
    } while (TVar1 == DOT);
    std::__cxx11::istringstream::~istringstream((istringstream *)&ss);
    return (Value *)this_00;
  }
  failwith<char_const(&)[28]>((char (*) [28])"encountered non table value");
}

Assistant:

inline Value* Value::ensureValue(const std::string& key)
{
    if (!valid())
        *this = Value((Table()));
    if (!is<Table>()) {
        failwith("encountered non table value");
    }

    std::istringstream ss(key);
    internal::Lexer lexer(ss);

    Value* current = this;
    while (true) {
        internal::Token t = lexer.nextKeyToken();
        if (!(t.type() == internal::TokenType::IDENT || t.type() == internal::TokenType::STRING)) {
            failwith("invalid key");
        }

        std::string part = t.strValue();
        t = lexer.nextKeyToken();
        if (t.type() == internal::TokenType::DOT) {
            if (Value* candidate = current->findChild(part)) {
                if (!candidate->is<Table>())
                    failwith("encountered non table value");

                current = candidate;
            } else {
                current = current->setChild(part, Table());
            }
        } else if (t.type() == internal::TokenType::END_OF_FILE) {
            if (Value* v = current->findChild(part))
                return v;
            return current->setChild(part, Value());
        } else {
            failwith("invalid key");
        }
    }
}